

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurl.cpp
# Opt level: O0

void TPZShapeHCurl<pzshape::TPZShapeLinear>::CalcH1ShapeOrders
               (TPZVec<int> *ordHCurl,TPZVec<int> *ordH1)

{
  MElementType MVar1;
  int iVar2;
  int64_t iVar3;
  int *piVar4;
  int **ppiVar5;
  TPZVec<int> *in_RSI;
  TPZVec<int> *in_RDI;
  int hMaxOrder;
  bool hQuadSide;
  int hSideOrder;
  int *ihSide;
  int *__end2;
  int *__begin2;
  TPZStack<int,_10> *__range2;
  int maxOrder;
  int sideOrder;
  TPZStack<int,_10> highDimSides;
  bool quadSide;
  int sideDim;
  int64_t iSide;
  int iCon;
  int64_t nConnects;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  int *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  bool local_fd;
  int local_d4;
  bool local_bd;
  int local_bc;
  bool local_b5;
  int local_b4;
  int *local_b0;
  int *local_a8;
  int *local_a0;
  TPZVec<int> *local_98;
  int local_8c;
  int local_88;
  TPZVec<int> local_78 [2];
  bool local_2d;
  int local_2c;
  long local_28;
  int local_20;
  undefined4 local_1c;
  undefined8 local_18;
  TPZVec<int> *local_10;
  TPZVec<int> *local_8;
  
  local_18 = 1;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar3 = TPZVec<int>::size(in_RSI);
  if (iVar3 != 1) {
    local_1c = 0xffffffff;
    (*local_10->_vptr_TPZVec[2])(local_10,1,&local_1c);
  }
  local_20 = 0;
  do {
    iVar2 = (int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
    if (0 < local_20) {
      return;
    }
    local_28 = (long)local_20 + 2;
    local_2c = pztopology::TPZLine::SideDimension(0x18bc22c);
    MVar1 = pztopology::TPZLine::Type((int)local_28);
    local_bd = true;
    if (MVar1 != EQuadrilateral) {
      MVar1 = pztopology::TPZLine::Type((int)local_28);
      local_bd = true;
      if (MVar1 != ECube) {
        MVar1 = pztopology::TPZLine::Type((int)local_28);
        local_bd = MVar1 == EPrisma;
      }
    }
    local_2d = local_bd;
    TPZStack<int,_10>::TPZStack
              ((TPZStack<int,_10> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    pztopology::TPZLine::HigherDimensionSides
              (iVar2,(TPZStack<int,_10> *)
                     CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    piVar4 = TPZVec<int>::operator[](local_8,(long)local_20);
    local_88 = *piVar4;
    local_d4 = local_88;
    if ((local_2d & 1U) != 0) {
      local_d4 = local_88 + 1;
    }
    local_8c = local_d4;
    local_98 = local_78;
    ppiVar5 = TPZVec<int>::begin(local_98);
    local_a0 = *ppiVar5;
    local_a8 = TPZVec<int>::end(local_98);
    for (; local_a0 != local_a8; local_a0 = local_a0 + 1) {
      local_b0 = local_a0;
      iVar2 = pztopology::TPZLine::SideDimension(0x18bc394);
      if (iVar2 != local_2c + 1) break;
      piVar4 = TPZVec<int>::operator[](local_8,(long)*local_b0 + -2);
      local_b4 = *piVar4;
      MVar1 = pztopology::TPZLine::Type(*local_b0);
      local_fd = true;
      if (MVar1 != EQuadrilateral) {
        MVar1 = pztopology::TPZLine::Type(*local_b0);
        local_fd = true;
        if (MVar1 != ECube) {
          MVar1 = pztopology::TPZLine::Type(*local_b0);
          local_fd = MVar1 == EPrisma;
        }
      }
      local_b5 = local_fd;
      in_stack_fffffffffffffef4 = local_b4;
      if (local_fd != false) {
        in_stack_fffffffffffffef4 = local_b4 + 1;
      }
      local_bc = in_stack_fffffffffffffef4;
      piVar4 = std::max<int>(&local_8c,&local_bc);
      local_8c = *piVar4;
    }
    in_stack_fffffffffffffedc = local_8c;
    in_stack_fffffffffffffee0 = TPZVec<int>::operator[](local_10,(long)local_20);
    *in_stack_fffffffffffffee0 = in_stack_fffffffffffffedc;
    TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x18bc513);
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

void TPZShapeHCurl<TSHAPE>::CalcH1ShapeOrders(
    const TPZVec<int> &ordHCurl,
    TPZVec<int> &ordH1)
{
    constexpr auto nConnects = TSHAPE::NSides-TSHAPE::NCornerNodes;
    if(ordH1.size() != nConnects)  ordH1.Resize(nConnects,-1);
    for(auto iCon = 0; iCon < nConnects; iCon++){
        const auto iSide = iCon + TSHAPE::NCornerNodes;
        const auto sideDim = TSHAPE::SideDimension(iSide);
        const bool quadSide =
            TSHAPE::Type(iSide) == EQuadrilateral ||
            TSHAPE::Type(iSide) == ECube ||
            TSHAPE::Type(iSide) == EPrisma;
        /*some H1 functions associated with the side iSide of dimension dim
          might be needed for computing the shape functions of a side with
          dimension dim+1 that contains the side iSide.
          It is also worth noting that quadrilateral sides require functions
          of ordH1er k+1*/
        TPZStack<int> highDimSides;
        TSHAPE::HigherDimensionSides(iSide, highDimSides);
        const auto sideOrder = ordHCurl[iCon];
        auto maxOrder = quadSide ? sideOrder + 1: sideOrder;
        for(auto &ihSide : highDimSides){
            if(TSHAPE::SideDimension(ihSide) != sideDim+1) break;
            else {
                const auto hSideOrder = ordHCurl[ihSide-TSHAPE::NCornerNodes];
                const auto hQuadSide =
                    TSHAPE::Type(ihSide) == EQuadrilateral ||
                    TSHAPE::Type(ihSide) == ECube ||
                    TSHAPE::Type(ihSide) == EPrisma;
                const auto hMaxOrder = hQuadSide ? hSideOrder + 1 : hSideOrder;
                maxOrder = std::max(maxOrder, hMaxOrder);
            }
        }
        ordH1[iCon] = maxOrder;
    }
}